

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O2

bool absl::lts_20250127::anon_unknown_70::IsSubcordInCordAt
               (CharIterator haystack,CharIterator needle_begin,CharIterator needle_end)

{
  ChunkIterator *this;
  CordRepBtree *pCVar1;
  bool bVar2;
  size_t __n;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __y;
  string_view haystack_chunk;
  string_view needle_chunk;
  reference local_50;
  reference local_40;
  
  this = (ChunkIterator *)(haystack.chunk_iterator_.btree_reader_.navigator_.node_ + 1);
  while (pCVar1 = haystack.chunk_iterator_.btree_reader_.navigator_.node_[4],
        haystack.chunk_iterator_.btree_reader_.navigator_.node_[4] !=
        needle_begin.chunk_iterator_.btree_reader_.navigator_.node_[4]) {
    local_50 = Cord::ChunkIterator::operator*((ChunkIterator *)&haystack_chunk);
    if (local_50._M_len == 0) {
      __assert_fail("!haystack_chunk.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/cord.cc"
                    ,0x50f,
                    "bool absl::lts_20250127::(anonymous namespace)::IsSubcordInCordAt(absl::Cord::CharIterator, absl::Cord::CharIterator, absl::Cord::CharIterator)"
                   );
    }
    local_40 = Cord::ChunkIterator::operator*(this);
    __n = local_50._M_len;
    if (local_40._M_len < local_50._M_len) {
      __n = local_40._M_len;
    }
    __x = std::basic_string_view<char,_std::char_traits<char>_>::substr(&local_50,0,__n);
    __y = std::basic_string_view<char,_std::char_traits<char>_>::substr(&local_40,0,__n);
    bVar2 = std::operator!=(__x,__y);
    if (bVar2) break;
    Cord::ChunkIterator::AdvanceBytes((ChunkIterator *)&haystack_chunk,__n);
    Cord::ChunkIterator::AdvanceBytes(this,__n);
  }
  return pCVar1 == needle_begin.chunk_iterator_.btree_reader_.navigator_.node_[4];
}

Assistant:

bool IsSubcordInCordAt(absl::Cord::CharIterator haystack,
                       absl::Cord::CharIterator needle_begin,
                       absl::Cord::CharIterator needle_end) {
  while (needle_begin != needle_end) {
    auto haystack_chunk = absl::Cord::ChunkRemaining(haystack);
    assert(!haystack_chunk.empty());
    auto needle_chunk = absl::Cord::ChunkRemaining(needle_begin);
    auto min_length = std::min(haystack_chunk.size(), needle_chunk.size());
    if (haystack_chunk.substr(0, min_length) !=
        needle_chunk.substr(0, min_length)) {
      return false;
    }
    absl::Cord::Advance(&haystack, min_length);
    absl::Cord::Advance(&needle_begin, min_length);
  }
  return true;
}